

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O1

err_t bakeBSTSStep5(octet *in,size_t in_len,bake_certval_i valb,void *state)

{
  u64 *state_00;
  size_t count;
  long lVar1;
  size_t count_00;
  ulong n;
  bool bVar2;
  bool_t bVar3;
  int iVar4;
  err_t eVar5;
  blob_t dest;
  u64 *dest_00;
  word *a;
  
  bVar3 = objIsOperable(state);
  if (bVar3 == 0) {
    return 0x6d;
  }
  lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
  count_00 = *(size_t *)(lVar1 + 0x38);
  if (in_len <= count_00 + 8) {
    return 0x6d;
  }
  n = *(ulong *)(lVar1 + 0x30);
  bVar3 = memIsValid(in,in_len);
  if (valb == (bake_certval_i)0x0) {
    return 0x6d;
  }
  if (bVar3 == 0) {
    return 0x6d;
  }
  a = (word *)(*state + (long)state);
  dest_00 = a + n * 2;
  state_00 = dest_00 + n;
  memSet(a,0xff,0x10);
  beltMACStart(state_00,(octet *)((long)state + 0x200),0x20);
  count = in_len - 8;
  beltMACStepA(in,count,state_00);
  beltMACStepA(a,0x10,state_00);
  bVar3 = beltMACStepV(in + (in_len - 8),state_00);
  if (bVar3 == 0) {
    return 0x209;
  }
  dest = blobCreate(count);
  if (dest == (blob_t)0x0) {
    eVar5 = 0x6e;
    bVar2 = false;
    goto LAB_001187d8;
  }
  memCopy(dest,in,count);
  beltCFBStart(state_00,(octet *)((long)state + 0x220),0x20,(octet *)a);
  beltCFBStepD(dest,count,state_00);
  u64From(dest_00,dest,count_00);
  iVar4 = wwCmp(dest_00,*(word **)(*(long *)((long)state + 0x18) + 0x38),n);
  if (iVar4 < 0) {
    eVar5 = (*valb)((octet *)a,(bign_params *)((long)state + 0x40),(octet *)((long)dest + count_00),
                    count - count_00);
    if (eVar5 != 0) goto LAB_001187cc;
    lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
    iVar4 = (**(code **)(lVar1 + 0x40))(a,a,lVar1,state_00);
    if (((iVar4 == 0) ||
        (lVar1 = *(long *)(*(long *)((long)state + 0x18) + 0x18),
        iVar4 = (**(code **)(lVar1 + 0x40))(a + n,count_00 + (long)a,lVar1,state_00), iVar4 == 0))
       || (bVar3 = ecpIsOnA(a,*(ec_o **)((long)state + 0x18),state_00), bVar3 == 0)) {
      eVar5 = 0x202;
      goto LAB_001187cc;
    }
    eVar5 = 0;
    bVar2 = true;
  }
  else {
    eVar5 = 0x209;
LAB_001187cc:
    bVar2 = false;
  }
  blobClose(dest);
LAB_001187d8:
  if (bVar2) {
    eVar5 = 0;
    bVar3 = ecAddMulA(a,*(ec_o **)((long)state + 0x18),state_00,2,
                      (*(ec_o **)((long)state + 0x18))->base,dest_00,n,a,
                      *(undefined8 *)((long)state + 0x30),(n >> 1) + 1);
    if (bVar3 == 0) {
      eVar5 = 0x1f6;
    }
    else {
      bVar3 = wwEq(a,*(word **)((long)state + 0x38),n * 2);
      if (bVar3 == 0) {
        eVar5 = 0x209;
      }
    }
  }
  return eVar5;
}

Assistant:

err_t bakeBSTSStep5(const octet in[], size_t in_len, bake_certval_i valb,
	void* state)
{
	err_t code;
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	// стек
	word* Qb;			/* [2 * n] */
	word* sb;			/* [n] */
	octet* block1;		/* [16] (совпадает с Qb) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (in_len <= no + 8 ||
		!memIsValid(in, in_len) ||
		valb == 0)
		return ERR_BAD_INPUT;
	// раскладка стека
	Qb = objEnd(s, word);
	sb = Qb + 2 * n;
	stack = sb + n;
	block1 = (octet*)Qb;
	// Tb == beltMAC(Yb || 1^128, K1)?
	memSet(block1, 0xFF, 16);
	beltMACStart(stack, s->K1, 32);
	beltMACStepA(in, in_len - 8, stack);
	beltMACStepA(block1, 16, stack);
	if (!beltMACStepV(in + in_len - 8, stack))
		return ERR_AUTH;
	// обработать Yb = [in_len - 8]in
	in_len -= 8;
	{
		blob_t Yb;
		// sb || certb <- beltCFBDecr(Yb, K2, 1^128)
		if ((Yb = blobCreate(in_len)) == 0)
			return ERR_OUTOFMEMORY;
		memCopy(Yb, in, in_len);
		beltCFBStart(stack, s->K2, 32, block1);
		beltCFBStepD(Yb, in_len, stack);
		// sb \in {0, 1,..., q - 1}?
		wwFrom(sb, Yb, no);
		if (wwCmp(sb, s->ec->order, n) >= 0)
		{
			blobClose(Yb);
			return ERR_AUTH;
		}
		// проверить certa
		code = valb((octet*)Qb, s->params, (octet*)Yb + no, in_len - no);
		ERR_CALL_HANDLE(code, blobClose(Yb));
		if (!qrFrom(ecX(Qb), (octet*)Qb, s->ec->f, stack) ||
			!qrFrom(ecY(Qb, n), (octet*)Qb + no, s->ec->f, stack) ||
			!ecpIsOnA(Qb, s->ec, stack))
			code = ERR_BAD_CERT;
		blobClose(Yb);
		ERR_CALL_CHECK(code);
	}
	// sb G + (2^l + t)Qa == Vb?
	if (!ecAddMulA(Qb, s->ec, stack, 2, s->ec->base, sb, n,
		Qb, s->t, n / 2 + 1))
		return ERR_BAD_PARAMS;
	if (!wwEq(Qb, s->Vb, 2 * n))
		return ERR_AUTH;
	// все нормально
	return ERR_OK;
}